

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O0

void test_skiplist_delete_several_all(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_status_t iVar2;
  int local_74;
  ion_sl_level_t h;
  ion_sl_node_t *cursor;
  ion_status_t status_1;
  ion_status_t status;
  int i;
  ion_byte_t value [10];
  ion_skiplist_t skiplist;
  planck_unit_test_t *tc_local;
  
  initialize_skiplist_std_conditions((ion_skiplist_t *)(value + 2));
  strcpy((char *)((long)&status.count + 2),"Wipe");
  status.error = '\t';
  status._1_3_ = 0;
  while( true ) {
    if (0x62 < (int)status._0_4_) {
      status.error = '\t';
      status._1_3_ = 0;
      while( true ) {
        if (0x62 < (int)status._0_4_) {
          local_74 = *(int *)(skiplist.super._24_8_ + 0x10);
          while( true ) {
            if (local_74 < 0) {
              sl_destroy((ion_skiplist_t *)(value + 2));
              return;
            }
            pVar1 = planck_unit_assert_true
                              (tc,(uint)(*(long *)(*(long *)(skiplist.super._24_8_ + 0x18) +
                                                  (long)local_74 * 8) == 0),0x4ab,
                               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                               ,"condition was false, expected true");
            if (pVar1 == '\0') break;
            local_74 = local_74 + -1;
          }
          longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
        }
        iVar2 = sl_delete((ion_skiplist_t *)(value + 2),&status);
        cursor._0_1_ = iVar2.error;
        pVar1 = planck_unit_assert_true
                          (tc,(uint)((char)cursor == '\0'),0x49e,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                           ,"condition was false, expected true");
        if (pVar1 == '\0') break;
        cursor._4_4_ = iVar2.count;
        pVar1 = planck_unit_assert_true
                          (tc,(uint)(cursor._4_4_ == 1),0x49f,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                           ,"condition was false, expected true");
        if (pVar1 == '\0') {
          longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
        }
        status._0_4_ = status._0_4_ + 3;
      }
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    iVar2 = sl_insert((ion_skiplist_t *)(value + 2),&status,(ion_value_t)((long)&status.count + 2));
    status_1.error = iVar2.error;
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(status_1.error == '\0'),0x492,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') break;
    status_1.count = iVar2.count;
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(status_1.count == 1),0x493,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    status._0_4_ = status._0_4_ + 3;
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_skiplist_delete_several_all(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	ion_byte_t value[10];

	strcpy((char *) value, "Wipe");

	int i;

	for (i = 9; i < 99; i += 3) {
		ion_status_t status = sl_insert(&skiplist, (ion_key_t) &i, value);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

#if ION_DEBUG
	printf("%s\n", "** BEFORE **");
	print_skiplist(&skip_list);
#endif

	for (i = 9; i < 99; i += 3) {
		ion_status_t status = sl_delete(&skiplist, (ion_key_t) &i);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

#if ION_DEBUG
	printf("%s\n", "** AFTER **");
	print_skiplist(&skip_list);
#endif

	ion_sl_node_t	*cursor = skiplist.head;
	ion_sl_level_t	h;

	for (h = cursor->height; h >= 0; h--) {
		PLANCK_UNIT_ASSERT_TRUE(tc, cursor->next[h] == NULL);
	}

	sl_destroy(&skiplist);
}